

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

base_t * base_new(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  _Bool _Var1;
  base_block_t *addr;
  base_t *base;
  long lVar2;
  pszind_t pind_last;
  size_t gap_size;
  size_t extent_sn_next;
  
  pind_last = 0;
  extent_sn_next = 0;
  base = (base_t *)0x0;
  addr = base_block_alloc(tsdn,(base_t *)0x0,extent_hooks,ind,&pind_last,&extent_sn_next,0x7f8,0x10)
  ;
  if (addr != (base_block_t *)0x0) {
    base = (base_t *)base_extent_bump_alloc_helper(&addr->extent,&gap_size,0x800,0x40);
    base->ind = ind;
    (base->extent_hooks).repr = extent_hooks;
    _Var1 = malloc_mutex_init(&base->mtx,"base",0x13,malloc_mutex_rank_exclusive);
    if (_Var1) {
      base_unmap(tsdn,extent_hooks,ind,addr,addr->size);
      base = (base_t *)0x0;
    }
    else {
      base->pind_last = pind_last;
      base->extent_sn_next = extent_sn_next;
      base->blocks = addr;
      base->auto_thp_switched = false;
      for (lVar2 = 0x98; lVar2 != 0x7d8; lVar2 = lVar2 + 8) {
        extent_heap_new((extent_heap_t *)((long)&base->ind + lVar2));
      }
      base->allocated = 0x90;
      base->resident = 0x1000;
      base->mapped = addr->size;
      base->n_thp = (ulong)(opt_metadata_thp == metadata_thp_always &&
                           init_system_thp_mode == thp_mode_default);
      base_extent_bump_alloc_post(base,&addr->extent,gap_size,base,0x800);
    }
  }
  return base;
}

Assistant:

base_t *
base_new(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	pszind_t pind_last = 0;
	size_t extent_sn_next = 0;
	base_block_t *block = base_block_alloc(tsdn, NULL, extent_hooks, ind,
	    &pind_last, &extent_sn_next, sizeof(base_t), QUANTUM);
	if (block == NULL) {
		return NULL;
	}

	size_t gap_size;
	size_t base_alignment = CACHELINE;
	size_t base_size = ALIGNMENT_CEILING(sizeof(base_t), base_alignment);
	base_t *base = (base_t *)base_extent_bump_alloc_helper(&block->extent,
	    &gap_size, base_size, base_alignment);
	base->ind = ind;
	atomic_store_p(&base->extent_hooks, extent_hooks, ATOMIC_RELAXED);
	if (malloc_mutex_init(&base->mtx, "base", WITNESS_RANK_BASE,
	    malloc_mutex_rank_exclusive)) {
		base_unmap(tsdn, extent_hooks, ind, block, block->size);
		return NULL;
	}
	base->pind_last = pind_last;
	base->extent_sn_next = extent_sn_next;
	base->blocks = block;
	base->auto_thp_switched = false;
	for (szind_t i = 0; i < SC_NSIZES; i++) {
		extent_heap_new(&base->avail[i]);
	}
	if (config_stats) {
		base->allocated = sizeof(base_block_t);
		base->resident = PAGE_CEILING(sizeof(base_block_t));
		base->mapped = block->size;
		base->n_thp = (opt_metadata_thp == metadata_thp_always) &&
		    metadata_thp_madvise() ? HUGEPAGE_CEILING(sizeof(base_block_t))
		    >> LG_HUGEPAGE : 0;
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		assert(base->n_thp << LG_HUGEPAGE <= base->mapped);
	}
	base_extent_bump_alloc_post(base, &block->extent, gap_size, base,
	    base_size);

	return base;
}